

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_path.cpp
# Opt level: O0

DWORD FILEGetDirectoryFromFullPathA(LPCSTR lpFullPath,DWORD nBufferLength,LPSTR lpBuffer)

{
  int iVar1;
  bool bVar2;
  uint local_3c;
  char *pcStack_38;
  DWORD dwRetLength;
  LPCSTR lpDirEnd;
  int i;
  int dir_len;
  int full_len;
  LPSTR lpBuffer_local;
  DWORD nBufferLength_local;
  LPCSTR lpFullPath_local;
  
  iVar1 = lstrlenA(lpFullPath);
  pcStack_38 = lpFullPath + iVar1;
  do {
    pcStack_38 = pcStack_38 + -1;
    bVar2 = false;
    if ((lpFullPath <= pcStack_38) && (bVar2 = false, *pcStack_38 != '/')) {
      bVar2 = *pcStack_38 != '\\';
    }
  } while (bVar2);
  iVar1 = (int)pcStack_38 - (int)lpFullPath;
  local_3c = iVar1 + 1;
  if ((int)local_3c < 1) {
    local_3c = 0;
  }
  else if (local_3c < nBufferLength) {
    for (lpDirEnd._4_4_ = 0; lpDirEnd._4_4_ < (int)local_3c; lpDirEnd._4_4_ = lpDirEnd._4_4_ + 1) {
      lpBuffer[lpDirEnd._4_4_] = lpFullPath[lpDirEnd._4_4_];
    }
    lpBuffer[lpDirEnd._4_4_] = '\0';
  }
  else {
    local_3c = iVar1 + 2;
  }
  return local_3c;
}

Assistant:

DWORD FILEGetDirectoryFromFullPathA( LPCSTR lpFullPath,
                     DWORD  nBufferLength,
                     LPSTR  lpBuffer )
{
    int    full_len, dir_len, i;
    LPCSTR lpDirEnd;
    DWORD  dwRetLength;

    full_len = lstrlenA( lpFullPath );

    /* look for the first path separator backwards */
    lpDirEnd = lpFullPath + full_len - 1;
    while( lpDirEnd >= lpFullPath && *lpDirEnd != '/' && *lpDirEnd != '\\')
    --lpDirEnd;

    dir_len = lpDirEnd - lpFullPath + 1; /* +1 for fencepost */

    if ( dir_len <= 0 )
    {
        dwRetLength = 0;
    }
    else if (static_cast<DWORD>(dir_len) >= nBufferLength)
    {
        dwRetLength = dir_len + 1; /* +1 for NULL char */
    }
    else
    {
    /* put the directory into the buffer, including 1 or more
       trailing path separators */
    for( i = 0; i < dir_len; ++i )
        *(lpBuffer + i) = *(lpFullPath + i);

    *(lpBuffer + i) = '\0';

    dwRetLength = dir_len;
    }

    return( dwRetLength );
}